

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::ContainerEqMatcher<std::vector<int,std::allocator<int>>>::
MatchAndExplain<std::vector<int,std::allocator<int>>>
          (ContainerEqMatcher<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *lhs,MatchResultListener *listener)

{
  ostream *this_00;
  int *piVar1;
  int iVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it_1;
  int *piVar3;
  size_t __n;
  int *piVar4;
  bool bVar5;
  const_iterator it;
  int *piVar6;
  char *pcVar7;
  bool bVar8;
  
  piVar6 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  __n = (long)piVar3 - (long)piVar6;
  if (__n == *(long *)(this + 8) - (long)*(void **)this) {
    if (piVar3 == piVar6) {
      bVar8 = true;
    }
    else {
      iVar2 = bcmp(piVar6,*(void **)this,__n);
      bVar8 = iVar2 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((!bVar8) && (this_00 = listener->stream_, this_00 != (ostream *)0x0)) {
    if (piVar6 == (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      pcVar7 = "which";
    }
    else {
      bVar5 = false;
      do {
        piVar3 = *(int **)this;
        piVar1 = *(int **)(this + 8);
        piVar4 = piVar1;
        if (piVar3 != piVar1) {
          do {
            piVar4 = piVar3;
            if (*piVar3 == *piVar6) break;
            piVar3 = piVar3 + 1;
            piVar4 = piVar1;
          } while (piVar3 != piVar1);
        }
        if (piVar4 == piVar1) {
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (this_00,"which has these unexpected elements: ",0x25);
            bVar5 = true;
          }
          std::ostream::operator<<((ostream *)this_00,*piVar6);
        }
        piVar6 = piVar6 + 1;
      } while (piVar6 != (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
      pcVar7 = "which";
      if (bVar5) {
        pcVar7 = ",\nand";
      }
    }
    piVar6 = *(int **)this;
    if (piVar6 != *(int **)(this + 8)) {
      bVar5 = false;
      do {
        piVar3 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar1 = (lhs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar4 = piVar1;
        if (piVar3 != piVar1) {
          do {
            piVar4 = piVar3;
            if (*piVar3 == *piVar6) break;
            piVar3 = piVar3 + 1;
            piVar4 = piVar1;
          } while (piVar3 != piVar1);
        }
        if (piVar4 == piVar1) {
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar7,5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (this_00," doesn\'t have these expected elements: ",0x27);
            bVar5 = true;
          }
          std::ostream::operator<<((ostream *)this_00,*piVar6);
        }
        piVar6 = piVar6 + 1;
      } while (piVar6 != *(int **)(this + 8));
    }
  }
  return bVar8;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }